

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O2

string * ZXing::NormalizeName_abi_cxx11_(string_view sv)

{
  _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::__1>
  *p_Var1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  string *in_RDI;
  size_type sVar6;
  _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::__1>
  *p_Var7;
  size_type sVar8;
  _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::__1>
  *p_Var9;
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __it._M_current = (char *)&local_40;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)__it._M_current,
             &local_41);
  pcVar2 = (in_RDI->_M_dataplus)._M_p;
  sVar8 = in_RDI->_M_string_length;
  for (sVar6 = 0; sVar8 != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = tolower((int)pcVar2[sVar6]);
    pcVar2[sVar6] = (char)iVar4;
  }
  p_Var9 = (_Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::__1>
            *)(in_RDI->_M_dataplus)._M_p;
  sVar8 = in_RDI->_M_string_length;
  p_Var1 = p_Var9 + sVar8;
  for (lVar5 = (long)sVar8 >> 2; p_Var7 = p_Var9, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9,__it);
    if (bVar3) goto LAB_0014e73e;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9 + 1,__it);
    p_Var7 = p_Var9 + 1;
    if (bVar3) goto LAB_0014e73e;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9 + 2,__it);
    p_Var7 = p_Var9 + 2;
    if (bVar3) goto LAB_0014e73e;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9 + 3,__it);
    p_Var7 = p_Var9 + 3;
    if (bVar3) goto LAB_0014e73e;
    p_Var9 = p_Var9 + 4;
    sVar8 = sVar8 - 4;
  }
  if (sVar8 == 1) {
LAB_0014e72d:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9,__it);
    p_Var7 = p_Var9;
    if (!bVar3) {
      p_Var7 = p_Var1;
    }
  }
  else if (sVar8 == 2) {
LAB_0014e71e:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9,__it);
    p_Var7 = p_Var9;
    if (!bVar3) {
      p_Var9 = p_Var9 + 1;
      goto LAB_0014e72d;
    }
  }
  else {
    if (sVar8 != 3) goto LAB_0014e769;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
            ::operator()(p_Var9,__it);
    if (!bVar3) {
      p_Var9 = p_Var9 + 1;
      goto LAB_0014e71e;
    }
  }
LAB_0014e73e:
  p_Var9 = p_Var7;
  if (p_Var7 != p_Var1) {
    while (p_Var7 = p_Var7 + 1, p_Var7 != p_Var1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ZXing::NormalizeName[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::$_1>
              ::operator()(p_Var7,__it);
      if (!bVar3) {
        *p_Var9 = *p_Var7;
        p_Var9 = p_Var9 + 1;
      }
    }
  }
LAB_0014e769:
  std::__cxx11::string::erase();
  return in_RDI;
}

Assistant:

static std::string NormalizeName(std::string_view sv)
{
	std::string str(sv);
	std::transform(str.begin(), str.end(), str.begin(), [](char c) { return (char)std::tolower(c); });
	str.erase(std::remove_if(str.begin(), str.end(), [](char c) { return Contains("_-[] ", c); }), str.end());
	return str;
}